

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O1

int szipLoadEntry(SZIPinfo *info,PHYSFS_uint32 idx)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  Byte *pBVar4;
  uint isdir;
  uint in_EAX;
  PHYSFS_uint16 *src;
  char *dst;
  void *pvVar5;
  undefined1 *puVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  uint local_38;
  PHYSFS_uint32 local_34;
  
  puVar7 = &local_38;
  psVar1 = (info->db).FileNameOffsets;
  lVar8 = psVar1[(ulong)idx + 1] - psVar1[idx];
  uVar9 = lVar8 * 2;
  if (uVar9 < 0x100) {
    puVar7 = (uint *)((long)&local_38 - (uVar9 + 0x17 & 0xfffffffffffffff0));
    puVar6 = (undefined1 *)puVar7;
  }
  else {
    puVar6 = (undefined1 *)0x0;
  }
  local_38 = in_EAX;
  local_34 = idx;
  *(undefined8 *)((long)puVar7 + -8) = 0x115095;
  src = (PHYSFS_uint16 *)__PHYSFS_initSmallAlloc(puVar6,uVar9);
  uVar9 = lVar8 * 4;
  if (uVar9 < 0x100) {
    puVar7 = (uint *)((long)puVar7 + -(uVar9 + 0x17 & 0xfffffffffffffff0));
    puVar6 = (undefined1 *)puVar7;
  }
  else {
    puVar6 = (undefined1 *)0x0;
  }
  *(undefined8 *)((long)puVar7 + -8) = 0x1150c3;
  dst = (char *)__PHYSFS_initSmallAlloc(puVar6,uVar9);
  bVar10 = false;
  if ((src != (PHYSFS_uint16 *)0x0) && (bVar10 = false, dst != (char *)0x0)) {
    psVar1 = (info->db).FileNameOffsets;
    local_38 = (uint)((byte)((info->db).IsDirs[local_34 >> 3] << ((byte)local_34 & 7)) >> 7);
    sVar2 = psVar1[idx];
    sVar3 = psVar1[(ulong)idx + 1];
    if (sVar3 != sVar2) {
      pBVar4 = (info->db).FileNames;
      lVar8 = 0;
      do {
        src[lVar8] = *(PHYSFS_uint16 *)(pBVar4 + lVar8 * 2 + sVar2 * 2);
        lVar8 = lVar8 + 1;
      } while (sVar3 - sVar2 != lVar8);
    }
    *(undefined8 *)((long)puVar7 + -8) = 0x115144;
    PHYSFS_utf8FromUtf16(src,dst,uVar9);
    isdir = local_38;
    *(undefined8 *)((long)puVar7 + -8) = 0x115152;
    pvVar5 = __PHYSFS_DirTreeAdd(&info->tree,dst,isdir);
    bVar10 = pvVar5 != (void *)0x0;
    if (bVar10) {
      *(PHYSFS_uint32 *)((long)pvVar5 + 0x28) = local_34;
    }
  }
  *(undefined8 *)((long)puVar7 + -8) = 0x11516b;
  __PHYSFS_smallFree(dst);
  *(undefined8 *)((long)puVar7 + -8) = 0x115173;
  __PHYSFS_smallFree(src);
  return (uint)bVar10;
}

Assistant:

static int szipLoadEntry(SZIPinfo *info, const PHYSFS_uint32 idx)
{
    const size_t utf16len = SzArEx_GetFileNameUtf16(&info->db, idx, NULL);
    const size_t utf16buflen = utf16len * 2;
    PHYSFS_uint16 *utf16 = (PHYSFS_uint16 *) __PHYSFS_smallAlloc(utf16buflen);
    const size_t utf8buflen = utf16len * 4;
    char *utf8 = (char *) __PHYSFS_smallAlloc(utf8buflen);
    int retval = 0;

    if (utf16 && utf8)
    {
        const int isdir = SzArEx_IsDir(&info->db, idx) != 0;
        SZIPentry *entry;
        SzArEx_GetFileNameUtf16(&info->db, idx, (UInt16 *) utf16);
        PHYSFS_utf8FromUtf16(utf16, utf8, utf8buflen);
        entry = (SZIPentry*) __PHYSFS_DirTreeAdd(&info->tree, utf8, isdir);
        retval = (entry != NULL);
        if (retval)
            entry->dbidx = idx;
    } /* if */

    __PHYSFS_smallFree(utf8);
    __PHYSFS_smallFree(utf16);

    return retval;
}